

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfDeque.c
# Opt level: O0

void * sbfDeque_popBack(sbfDeque dq)

{
  undefined8 *puVar1;
  long in_RDI;
  void *vp;
  sbfDequeItem dqe;
  void *local_8;
  
  puVar1 = (undefined8 *)**(long **)(*(long *)(in_RDI + 0x10) + 8);
  if (puVar1 == (undefined8 *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = (void *)*puVar1;
    if (puVar1[1] == 0) {
      *(undefined8 *)(in_RDI + 0x10) = puVar1[2];
    }
    else {
      *(undefined8 *)(puVar1[1] + 0x10) = puVar1[2];
    }
    *(undefined8 *)puVar1[2] = puVar1[1];
    sbfPool_put(local_8);
  }
  return local_8;
}

Assistant:

void*
sbfDeque_popBack (sbfDeque dq)
{
    sbfDequeItem dqe;
    void*        vp;

    dqe = TAILQ_LAST (&dq->mList, sbfDequeItemListImpl);
    if (dqe == NULL)
        return NULL;
    vp = dqe->mPointer;

    TAILQ_REMOVE (&dq->mList, dqe, mListEntry);
    sbfPool_put (dqe);

    return vp;
}